

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_module_t::wasm_module_t
          (wasm_module_t *this,RefPtr<wabt::interp::Module> *ptr,wasm_byte_vec_t *in)

{
  RefPtr<wabt::interp::Object> local_30;
  
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Module>(&local_30,ptr);
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr((RefPtr<wabt::interp::Object> *)this,&local_30)
  ;
  wabt::interp::RefPtr<wabt::interp::Object>::reset(&local_30);
  wasm_byte_vec_copy(&this->binary,in);
  return;
}

Assistant:

wasm_module_t(RefPtr<Module> ptr, const wasm_byte_vec_t* in)
      : wasm_ref_t(ptr) {
    wasm_byte_vec_copy(&binary, in);
  }